

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_scalar<ncnn::binary_op_rpow>(Mat *a,float b,Mat *c,Option *opt)

{
  long *in_RSI;
  float *x;
  long *in_RDI;
  float fVar1;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  int d;
  int h;
  int w;
  binary_op_rpow op;
  Mat *m;
  Mat *m_1;
  binary_op_rpow *this;
  int local_234;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined4 local_218;
  long local_210;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined8 local_1f0;
  float *local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  long local_1c0;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined8 local_1a0;
  long local_198;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  long *local_168;
  long *local_158;
  undefined1 local_14d;
  int local_14c;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_128;
  binary_op_rpow *local_120;
  undefined1 local_115;
  int local_114;
  undefined8 *local_108;
  undefined8 *local_f8;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  float *local_d8;
  undefined4 local_cc;
  int local_c8;
  int local_c4;
  undefined8 *local_c0;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  long local_a0;
  undefined4 local_94;
  int local_90;
  int local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  binary_op_rpow *local_48;
  undefined8 *local_38;
  
  local_178 = *(int *)((long)in_RDI + 0x2c);
  local_17c = (int)in_RDI[6];
  local_180 = *(int *)((long)in_RDI + 0x34);
  local_184 = (int)in_RDI[7];
  local_188 = local_178 * local_17c * local_180;
  local_168 = in_RSI;
  local_158 = in_RDI;
  for (local_18c = 0; local_18c < local_184; local_18c = local_18c + 1) {
    local_140 = &local_1e0;
    local_8c = *(int *)((long)local_158 + 0x2c);
    local_90 = (int)local_158[6];
    local_94 = *(undefined4 *)((long)local_158 + 0x34);
    local_198 = *local_158 + local_158[8] * (long)local_18c * local_158[2];
    local_a8 = local_158[2];
    local_ac = (undefined4)local_158[3];
    local_b8 = local_158[4];
    local_88 = &local_1e0;
    local_78 = (long)local_8c * (long)local_90 * local_a8;
    local_138 = &local_1e0;
    local_128 = &local_1e0;
    local_108 = &local_230;
    local_c4 = *(int *)((long)local_168 + 0x2c);
    local_c8 = (int)local_168[6];
    local_cc = *(undefined4 *)((long)local_168 + 0x34);
    x = (float *)(*local_168 + local_168[8] * (long)local_18c * local_168[2]);
    local_e0 = local_168[2];
    local_e4 = (undefined4)local_168[3];
    local_f0 = local_168[4];
    local_c0 = &local_230;
    local_68 = (long)local_c4 * (long)local_c8 * local_e0;
    local_f8 = &local_230;
    this = (binary_op_rpow *)&local_230;
    local_1a8 = 0;
    local_1ac = 0;
    local_1b0 = 0;
    local_1b4 = 0;
    local_1c8 = 0;
    local_1d0 = 0;
    local_1d8 = 0;
    local_1e0 = 0;
    local_6c = 0x10;
    local_7c = 0x10;
    local_114 = local_18c;
    local_115 = 1;
    local_14c = local_18c;
    local_14d = 1;
    local_1a0 = 0;
    local_1b8 = 0;
    local_230 = 0;
    local_220 = 0;
    local_218 = 0;
    local_208 = 0;
    local_204 = 0;
    local_200 = 0;
    local_1fc = 0;
    local_1f8 = 0;
    local_1f0 = 0;
    local_228 = 0;
    local_1e8 = x;
    local_120 = this;
    local_d8 = x;
    local_a0 = local_198;
    local_48 = this;
    local_38 = local_128;
    local_210 = local_f0;
    local_1c0 = local_b8;
    for (local_234 = 0; local_234 < local_188; local_234 = local_234 + 1) {
      fVar1 = binary_op_rpow::operator()(this,x,(float *)0xfed828);
      local_1e8[local_234] = fVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar(const Mat& a, float b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], b);
        }
    }

    return 0;
}